

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hh
# Opt level: O0

void __thiscall xt::_Vector::_Vector(_Vector *this,uint cnt,uint shift,Node *root,ObjectArray *tail)

{
  ObjectArray *tail_local;
  Node *root_local;
  uint shift_local;
  uint cnt_local;
  _Vector *this_local;
  
  this->cnt = cnt;
  this->shift = shift;
  std::shared_ptr<xt::_Node>::shared_ptr(&this->root,root);
  std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::shared_ptr
            (&this->tail,tail);
  return;
}

Assistant:

_Vector(unsigned int cnt, unsigned int shift, Node root, ObjectArray tail) : cnt(cnt), shift(shift), root(root), tail(tail) {}